

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O1

int stbtt_BakeFontBitmap
              (uchar *data,int offset,float pixel_height,uchar *pixels,int pw,int ph,int first_char,
              int num_chars,stbtt_bakedchar *chardata)

{
  int iVar1;
  int iVar2;
  int out_h;
  long lVar3;
  int out_w;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 local_c8 [8];
  stbtt_fontinfo f;
  int lsb;
  int local_70;
  int local_6c;
  int advance;
  int x1;
  int y1;
  int local_5c;
  ulong local_58;
  ulong local_50;
  int local_44;
  int local_40;
  int x0;
  int y0;
  uint local_34;
  
  local_c8 = (undefined1  [8])0x0;
  y0 = (int)pixel_height;
  iVar1 = stbtt_InitFont((stbtt_fontinfo *)local_c8,data,offset);
  if (iVar1 == 0) {
    local_34 = 0xffffffff;
  }
  else {
    y1 = pw;
    x0 = ph;
    memset(pixels,0,(long)(ph * pw));
    if (num_chars < 1) {
      local_34 = 1;
    }
    else {
      lVar3 = (long)f.head;
      y0 = (int)((float)y0 /
                (float)(int)(((int)(short)((ushort)*(byte *)((long)f.userdata + lVar3 + 4) << 8) |
                             (uint)*(byte *)((long)f.userdata + lVar3 + 5)) -
                            ((int)(short)((ushort)*(byte *)((long)f.userdata + lVar3 + 6) << 8) |
                            (uint)*(byte *)((long)f.userdata + lVar3 + 7))));
      lVar3 = 0;
      uVar5 = 1;
      uVar6 = 1;
      local_34 = 1;
      iVar1 = x0;
      do {
        local_58 = uVar5;
        local_50 = uVar6;
        iVar2 = stbtt_FindGlyphIndex((stbtt_fontinfo *)local_c8,first_char);
        stbtt_GetGlyphHMetrics((stbtt_fontinfo *)local_c8,iVar2,&local_70,&f.indexToLocFormat);
        x1 = iVar2;
        stbtt_GetGlyphBitmapBoxSubpixel
                  ((stbtt_fontinfo *)local_c8,iVar2,(float)y0,(float)y0,0.0,0.0,&local_44,&local_40,
                   &local_6c,&advance);
        out_w = local_6c - local_44;
        out_h = advance - local_40;
        iVar2 = (int)local_58 + out_w + 1;
        uVar6 = local_50 & 0xffffffff;
        if (y1 <= iVar2) {
          uVar6 = (ulong)local_34;
        }
        uVar5 = local_58 & 0xffffffff;
        if (y1 <= iVar2) {
          uVar5 = 1;
        }
        iVar2 = (int)uVar6;
        uVar7 = iVar2 + out_h + 1;
        if ((int)uVar7 < iVar1) {
          local_58 = CONCAT44(local_58._4_4_,first_char);
          iVar1 = (int)uVar5 + out_w;
          if (y1 <= iVar1) {
            __assert_fail("x+gw < pw",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                          ,0xa04,
                          "int stbtt_BakeFontBitmap(const unsigned char *, int, float, unsigned char *, int, int, int, int, stbtt_bakedchar *)"
                         );
          }
          iVar4 = iVar2 + out_h;
          if (x0 <= iVar4) {
            __assert_fail("y+gh < ph",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                          ,0xa05,
                          "int stbtt_BakeFontBitmap(const unsigned char *, int, float, unsigned char *, int, int, int, int, stbtt_bakedchar *)"
                         );
          }
          local_50 = (ulong)(int)uVar5;
          stbtt_MakeGlyphBitmapSubpixel
                    ((stbtt_fontinfo *)local_c8,pixels + (long)(iVar2 * y1) + local_50,out_w,out_h,
                     y1,(float)y0,(float)y0,0.0,0.0,x1);
          chardata->x0 = (unsigned_short)local_50;
          chardata->y0 = (unsigned_short)uVar6;
          chardata->x1 = (unsigned_short)iVar1;
          chardata->y1 = (unsigned_short)iVar4;
          chardata->xadvance = (float)local_70 * (float)y0;
          chardata->xoff = (float)local_44;
          chardata->yoff = (float)local_40;
          if ((int)local_34 <= iVar4) {
            local_34 = uVar7;
          }
          uVar5 = (ulong)(iVar1 + 1);
          iVar1 = x0;
        }
        else {
          local_5c = (int)lVar3;
          local_58._0_4_ = first_char;
        }
        if (iVar1 <= (int)uVar7) {
          return local_5c;
        }
        lVar3 = lVar3 + -1;
        first_char = (int)local_58 + 1;
        chardata = chardata + 1;
      } while (-(ulong)(uint)num_chars != lVar3);
    }
  }
  return local_34;
}

Assistant:

STBTT_DEF int stbtt_BakeFontBitmap(const unsigned char *data, int offset,  // font location (use offset=0 for plain .ttf)
                                float pixel_height,                     // height of font in pixels
                                unsigned char *pixels, int pw, int ph,  // bitmap to be filled in
                                int first_char, int num_chars,          // characters to bake
                                stbtt_bakedchar *chardata)
{
   float scale;
   int x,y,bottom_y, i;
   stbtt_fontinfo f;
   f.userdata = NULL;
   if (!stbtt_InitFont(&f, data, offset))
      return -1;
   STBTT_memset(pixels, 0, pw*ph); // background of 0 around pixels
   x=y=1;
   bottom_y = 1;

   scale = stbtt_ScaleForPixelHeight(&f, pixel_height);

   for (i=0; i < num_chars; ++i) {
      int advance, lsb, x0,y0,x1,y1,gw,gh;
      int g = stbtt_FindGlyphIndex(&f, first_char + i);
      stbtt_GetGlyphHMetrics(&f, g, &advance, &lsb);
      stbtt_GetGlyphBitmapBox(&f, g, scale,scale, &x0,&y0,&x1,&y1);
      gw = x1-x0;
      gh = y1-y0;
      if (x + gw + 1 >= pw)
         y = bottom_y, x = 1; // advance to next row
      if (y + gh + 1 >= ph) // check if it fits vertically AFTER potentially moving to next row
         return -i;
      STBTT_assert(x+gw < pw);
      STBTT_assert(y+gh < ph);
      stbtt_MakeGlyphBitmap(&f, pixels+x+y*pw, gw,gh,pw, scale,scale, g);
      chardata[i].x0 = (stbtt_int16) x;
      chardata[i].y0 = (stbtt_int16) y;
      chardata[i].x1 = (stbtt_int16) (x + gw);
      chardata[i].y1 = (stbtt_int16) (y + gh);
      chardata[i].xadvance = scale * advance;
      chardata[i].xoff     = (float) x0;
      chardata[i].yoff     = (float) y0;
      x = x + gw + 1;
      if (y+gh+1 > bottom_y)
         bottom_y = y+gh+1;
   }
   return bottom_y;
}